

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTests(UnitTest *unit_test)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TestSuite *this;
  TestInfo *test_info;
  int test_count;
  char *pcVar4;
  int i;
  int i_00;
  int j;
  string local_50;
  
  uVar2 = UnitTest::failed_test_count(unit_test);
  ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
  FormatTestCount_abi_cxx11_(&local_50,(testing *)(ulong)uVar2,test_count);
  printf("%s, listed below:\n",local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(unit_test->impl_->test_suites_).
                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(unit_test->impl_->test_suites_).
                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    this = UnitTest::GetTestSuite(unit_test,i_00);
    if (this->should_run_ == true) {
      iVar3 = TestSuite::failed_test_count(this);
      if (iVar3 != 0) {
        for (iVar3 = 0;
            iVar3 < (int)((ulong)((long)(this->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
            iVar3 = iVar3 + 1) {
          test_info = TestSuite::GetTestInfo(this,iVar3);
          if (test_info->should_run_ == true) {
            bVar1 = TestResult::Failed(&test_info->result_);
            if (bVar1) {
              ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
              printf("%s.%s",(this->name_)._M_dataplus._M_p,(test_info->name_)._M_dataplus._M_p);
              PrintFullTestCommentIfPresent(test_info);
              putchar(10);
            }
          }
        }
      }
    }
  }
  pcVar4 = "TESTS";
  if (uVar2 == 1) {
    pcVar4 = "TEST";
  }
  printf("\n%2d FAILED %s\n",(ulong)uVar2,pcVar4);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTests(const UnitTest& unit_test) {
  const int failed_test_count = unit_test.failed_test_count();
  ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
  printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run() || (test_suite.failed_test_count() == 0)) {
      continue;
    }
    for (int j = 0; j < test_suite.total_test_count(); ++j) {
      const TestInfo& test_info = *test_suite.GetTestInfo(j);
      if (!test_info.should_run() || !test_info.result()->Failed()) {
        continue;
      }
      ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
      printf("%s.%s", test_suite.name(), test_info.name());
      PrintFullTestCommentIfPresent(test_info);
      printf("\n");
    }
  }
  printf("\n%2d FAILED %s\n", failed_test_count,
         failed_test_count == 1 ? "TEST" : "TESTS");
}